

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum_dls.cpp
# Opt level: O2

void Timidity::LoadSubChunks(RIFF_Chunk *chunk,BYTE *data,DWORD left)

{
  DWORD *pDVar1;
  DWORD DVar2;
  RIFF_Chunk *pRVar3;
  RIFF_Chunk *chunk_00;
  uint uVar4;
  RIFF_Chunk **ppRVar5;
  DWORD left_00;
  RIFF_Chunk *pRVar6;
  uint uVar7;
  DWORD *data_00;
  
  while (8 < left) {
    chunk_00 = (RIFF_Chunk *)operator_new(0x28);
    chunk_00->next = (RIFF_Chunk *)0x0;
    chunk_00->magic = 0;
    chunk_00->length = 0;
    *(undefined8 *)&chunk_00->subtype = 0;
    chunk_00->data = (BYTE *)0x0;
    chunk_00->child = (RIFF_Chunk *)0x0;
    ppRVar5 = &chunk->child;
    pRVar3 = (RIFF_Chunk *)0x0;
    do {
      pRVar6 = pRVar3;
      pRVar3 = *ppRVar5;
      ppRVar5 = &pRVar3->next;
    } while (pRVar3 != (RIFF_Chunk *)0x0);
    ppRVar5 = &pRVar6->next;
    if (pRVar6 == (RIFF_Chunk *)0x0) {
      ppRVar5 = &chunk->child;
    }
    *ppRVar5 = chunk_00;
    DVar2 = *(DWORD *)data;
    chunk_00->magic = DVar2;
    uVar4 = *(uint *)((long)data + 4);
    chunk_00->length = uVar4;
    pDVar1 = (DWORD *)((long)data + 8);
    uVar7 = left - 8;
    chunk_00->data = (BYTE *)pDVar1;
    if (uVar7 < uVar4) {
      chunk_00->length = uVar7;
      uVar4 = uVar7;
    }
    data_00 = pDVar1;
    left_00 = uVar4;
    if ((DVar2 == 0x46464952 || DVar2 == 0x5453494c) && (3 < uVar4)) {
      chunk_00->subtype = *(DWORD *)((long)data + 8);
      data_00 = (DWORD *)((long)data + 0xc);
      left_00 = uVar4 - 4;
    }
    if ((DVar2 == 0x5453494c) || (DVar2 == 0x46464952)) {
      LoadSubChunks(chunk_00,(BYTE *)data_00,left_00);
      uVar4 = chunk_00->length;
    }
    uVar4 = (uVar4 & 1) + uVar4;
    data = (BYTE *)((long)pDVar1 + (ulong)uVar4);
    left = uVar7 - uVar4;
  }
  return;
}

Assistant:

static void LoadSubChunks(RIFF_Chunk *chunk, BYTE *data, DWORD left)
{
	BYTE *subchunkData;
	DWORD subchunkDataLen;

	while ( left > 8 ) {
		RIFF_Chunk *child = new RIFF_Chunk;
		RIFF_Chunk *next, *prev = NULL;
		for ( next = chunk->child; next; next = next->next ) {
			prev = next;
		}
		if ( prev ) {
			prev->next = child;
		} else {
			chunk->child = child;
		}

		child->magic = *(DWORD *)data;
		data += 4;
		left -= 4;
		child->length = LittleLong(*(DWORD *)data);
		data += 4;
		left -= 4;
		child->data = data;

		if ( child->length > left ) {
			child->length = left;
		}

		subchunkData = child->data;
		subchunkDataLen = child->length;
		if ( ChunkHasSubType(child->magic) && subchunkDataLen >= 4 ) {
			child->subtype = *(DWORD *)subchunkData;
			subchunkData += 4;
			subchunkDataLen -= 4;
		}
		if ( ChunkHasSubChunks(child->magic) ) {
			LoadSubChunks(child, subchunkData, subchunkDataLen);
		}

		data += child->length + (child->length & 1);
		left -= child->length + (child->length & 1);
	}
}